

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_linear_resampler_init
                    (ma_linear_resampler_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_linear_resampler *pResampler)

{
  ma_result mVar1;
  void *pHeap;
  ma_linear_resampler_heap_layout heapLayout;
  ma_linear_resampler_heap_layout local_48;
  
  mVar1 = ma_linear_resampler_get_heap_layout(pConfig,&local_48);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_48.sizeInBytes == 0) {
    pHeap = (void *)0x0;
LAB_001a0714:
    mVar1 = ma_linear_resampler_init_preallocated(pConfig,pHeap,pResampler);
    if (mVar1 == MA_SUCCESS) {
      pResampler->_ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_48.sizeInBytes);
LAB_001a070c:
      if (pHeap != (void *)0x0) goto LAB_001a0714;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)
                        (local_48.sizeInBytes,pAllocationCallbacks->pUserData);
      goto LAB_001a070c;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_linear_resampler_init(const ma_linear_resampler_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_linear_resampler* pResampler)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_linear_resampler_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_linear_resampler_init_preallocated(pConfig, pHeap, pResampler);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pResampler->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}